

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  SUNMatrix A_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  iVar8 = SMCompatible_Band(A,B);
  if (iVar8 == 0) {
    iVar8 = 1;
  }
  else {
    pvVar1 = B->content;
    lVar11 = *(long *)((long)pvVar1 + 0x18);
    pvVar2 = A->content;
    lVar9 = *(long *)((long)pvVar2 + 0x18);
    if ((lVar9 < lVar11) ||
       (lVar3 = *(long *)((long)pvVar1 + 0x20), *(long *)((long)pvVar2 + 0x20) < lVar3)) {
      lVar3 = *(long *)((long)pvVar2 + 8);
      lVar10 = *(long *)((long)pvVar1 + 0x20);
      if (*(long *)((long)pvVar1 + 0x20) < *(long *)((long)pvVar2 + 0x20)) {
        lVar10 = *(long *)((long)pvVar2 + 0x20);
      }
      if (lVar11 < lVar9) {
        lVar11 = lVar9;
      }
      lVar9 = lVar3 + -1;
      if (lVar10 + lVar11 < lVar3) {
        lVar9 = lVar10 + lVar11;
      }
      A_00 = SUNBandMatrixStorage(lVar3,lVar11,lVar10,lVar9);
      pvVar1 = A->content;
      lVar11 = *(long *)((long)pvVar1 + 8);
      if (0 < lVar11) {
        lVar9 = *(long *)((long)pvVar1 + 0x40);
        lVar3 = *(long *)((long)pvVar1 + 0x20);
        lVar10 = *(long *)((long)pvVar1 + 0x28);
        lVar4 = *(long *)((long)A_00->content + 0x28);
        lVar5 = *(long *)((long)A_00->content + 0x40);
        lVar6 = *(long *)((long)pvVar1 + 0x18);
        lVar13 = 0;
        do {
          if (-lVar6 <= lVar3) {
            lVar7 = *(long *)(lVar9 + lVar13 * 8);
            lVar14 = *(long *)(lVar5 + lVar13 * 8);
            lVar12 = -lVar6;
            do {
              *(double *)(lVar14 + lVar4 * 8 + lVar12 * 8) =
                   *(double *)(lVar7 + lVar10 * 8 + lVar12 * 8) * c;
              lVar12 = lVar12 + 1;
            } while (lVar3 + 1 != lVar12);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar11);
      }
      pvVar2 = B->content;
      lVar11 = *(long *)((long)pvVar2 + 8);
      if (0 < lVar11) {
        lVar9 = *(long *)((long)pvVar2 + 0x40);
        lVar3 = *(long *)((long)pvVar2 + 0x20);
        lVar10 = *(long *)((long)pvVar2 + 0x28);
        lVar4 = *(long *)((long)A_00->content + 0x28);
        lVar5 = *(long *)((long)A_00->content + 0x40);
        lVar6 = *(long *)((long)pvVar2 + 0x18);
        lVar13 = 0;
        do {
          if (-lVar6 <= lVar3) {
            lVar7 = *(long *)(lVar9 + lVar13 * 8);
            lVar12 = *(long *)(lVar5 + lVar13 * 8) + lVar4 * 8;
            lVar14 = -lVar6;
            do {
              *(double *)(lVar12 + lVar14 * 8) =
                   *(double *)(lVar7 + lVar10 * 8 + lVar14 * 8) + *(double *)(lVar12 + lVar14 * 8);
              lVar14 = lVar14 + 1;
            } while (lVar3 + 1 != lVar14);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar11);
      }
      free(*(void **)((long)pvVar1 + 0x30));
      pvVar1 = A->content;
      iVar8 = 0;
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      free(*(void **)((long)pvVar1 + 0x40));
      pvVar1 = A->content;
      *(undefined8 *)((long)pvVar1 + 0x40) = 0;
      free(pvVar1);
      A->content = (void *)0x0;
      A->content = A_00->content;
      A_00->content = (void *)0x0;
      SUNMatDestroy_Band(A_00);
    }
    else {
      lVar9 = *(long *)((long)pvVar2 + 8);
      if (0 < lVar9) {
        lVar10 = *(long *)((long)pvVar2 + 0x28);
        lVar4 = *(long *)((long)pvVar2 + 0x40);
        lVar5 = *(long *)((long)pvVar1 + 0x28);
        lVar6 = *(long *)((long)pvVar1 + 0x40);
        lVar13 = 0;
        do {
          if (SBORROW8(lVar3,-lVar11) == lVar3 + lVar11 < 0) {
            lVar12 = *(long *)(lVar4 + lVar13 * 8) + lVar10 * 8;
            lVar7 = *(long *)(lVar6 + lVar13 * 8);
            lVar14 = -lVar11;
            do {
              *(double *)(lVar12 + lVar14 * 8) =
                   *(double *)(lVar12 + lVar14 * 8) * c +
                   *(double *)(lVar7 + lVar5 * 8 + lVar14 * 8);
              lVar14 = lVar14 + 1;
            } while (lVar3 + 1 != lVar14);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar9);
      }
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return 1;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }
  
  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return 0;
}